

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O0

idx_t __thiscall
duckdb::StandardColumnData::Fetch
          (StandardColumnData *this,ColumnScanState *state,row_t row_id,Vector *result)

{
  bool bVar1;
  idx_t row_id_00;
  long in_RSI;
  Vector *in_RDI;
  idx_t scan_count;
  ColumnScanState child_state;
  value_type *in_stack_ffffffffffffff18;
  ColumnScanState *in_stack_ffffffffffffff20;
  vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>
  *in_stack_ffffffffffffff30;
  ColumnScanState *in_stack_ffffffffffffff38;
  ColumnData *in_stack_ffffffffffffff40;
  ColumnScanState local_b8;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::empty
                    (in_stack_ffffffffffffff30);
  if (bVar1) {
    in_stack_ffffffffffffff20 = &local_b8;
    ColumnScanState::ColumnScanState(in_stack_ffffffffffffff20);
    local_b8.scan_options.ptr = *(TableScanOptions **)(local_10 + 0x90);
    ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::push_back
              ((vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_> *)
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    ColumnScanState::~ColumnScanState(in_stack_ffffffffffffff20);
  }
  row_id_00 = ColumnData::Fetch(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                (row_t)in_stack_ffffffffffffff30,in_RDI);
  vector<duckdb::ColumnScanState,_true>::operator[]
            ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff20,
             (size_type)&in_RDI[2].validity.super_TemplatedValidityMask<unsigned_long>.capacity);
  ColumnData::Fetch(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,row_id_00,in_RDI);
  return row_id_00;
}

Assistant:

idx_t StandardColumnData::Fetch(ColumnScanState &state, row_t row_id, Vector &result) {
	// fetch validity mask
	if (state.child_states.empty()) {
		ColumnScanState child_state;
		child_state.scan_options = state.scan_options;
		state.child_states.push_back(std::move(child_state));
	}
	auto scan_count = ColumnData::Fetch(state, row_id, result);
	validity.Fetch(state.child_states[0], row_id, result);
	return scan_count;
}